

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Node * __thiscall parser::Parser::parse(Node *__return_storage_ptr__,Parser *this,Tokens *tokens)

{
  State curState;
  bool bVar1;
  reference pvVar2;
  pointer pTVar3;
  reference pTVar4;
  ostream *poVar5;
  ParserError *pPVar6;
  size_type sVar7;
  reference pvVar8;
  allocator<char> local_289;
  string local_288;
  undefined1 local_261;
  ParserError *local_260;
  undefined1 local_252;
  allocator<char> local_251;
  string local_250;
  State local_22c;
  int *local_228;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_220;
  const_iterator local_218;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_210;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  const_iterator local_200;
  Production local_1f8;
  Node local_1d8;
  Node *local_178;
  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
  local_170;
  const_iterator local_168;
  const_iterator local_160;
  vector<parser::Node,_std::allocator<parser::Node>_> *local_158;
  vector<parser::Node,_std::allocator<parser::Node>_> *local_150;
  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
  local_148;
  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
  local_140;
  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
  local_138;
  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
  local_130;
  iterator start;
  Nodes nodes;
  string local_108;
  __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
  local_e8;
  Node local_e0;
  undefined1 local_80 [8];
  ActionState actionState;
  const_iterator token;
  Nodes nodeStack;
  undefined1 local_38 [8];
  StateStack stateStack;
  Tokens *tokens_local;
  Parser *this_local;
  
  stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)tokens;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_38,&StartNonTerminal);
  std::vector<parser::Node,_std::allocator<parser::Node>_>::vector
            ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
  actionState.reduceCount =
       (size_t)std::vector<lexer::Token,_std::allocator<lexer::Token>_>::begin
                         ((vector<lexer::Token,_std::allocator<lexer::Token>_> *)
                          stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  do {
    while( true ) {
      while( true ) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)local_38);
        curState = *pvVar2;
        pTVar3 = __gnu_cxx::
                 __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                 ::operator->((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                               *)&actionState.reduceCount);
        action((ActionState *)local_80,this,curState,pTVar3->tokenId);
        if (local_80._0_4_ != Shift) break;
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                 ::operator*((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                              *)&actionState.reduceCount);
        Node::Node(&local_e0,pTVar4);
        std::vector<parser::Node,_std::allocator<parser::Node>_>::push_back
                  ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token,&local_e0);
        Node::~Node(&local_e0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_38,
                   (value_type_conflict1 *)(local_80 + 4));
        if ((this->debug & 1U) != 0) {
          pTVar4 = __gnu_cxx::
                   __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                   ::operator*((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                                *)&actionState.reduceCount);
          poVar5 = stringifyStep(this,(ostream *)&std::cout,(StateStack *)local_38,(Nodes *)&token,
                                 (ActionState *)local_80,pTVar4);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        __gnu_cxx::
        __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
        ::operator++((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                      *)&actionState.reduceCount);
        local_e8._M_current =
             (Token *)std::vector<lexer::Token,_std::allocator<lexer::Token>_>::end
                                ((vector<lexer::Token,_std::allocator<lexer::Token>_> *)
                                 stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                            *)&actionState.reduceCount,&local_e8);
        if (bVar1) {
          nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          pPVar6 = (ParserError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"error state",
                     (allocator<char> *)
                     ((long)&nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          ParserError::ParserError(pPVar6,&local_108);
          nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          __cxa_throw(pPVar6,&ParserError::typeinfo,ParserError::~ParserError);
        }
      }
      if (local_80._0_4_ != Reduce) break;
      std::vector<parser::Node,_std::allocator<parser::Node>_>::vector
                ((vector<parser::Node,_std::allocator<parser::Node>_> *)&start);
      local_138._M_current =
           (Node *)std::vector<parser::Node,_std::allocator<parser::Node>_>::end
                             ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
      local_140 = __gnu_cxx::
                  __normal_iterator<parser::Node_*,_std::vector<parser::Node,_std::allocator<parser::Node>_>_>
                  ::operator-(&local_138,actionState._8_8_);
      local_130 = local_140;
      local_148._M_current =
           (Node *)std::vector<parser::Node,_std::allocator<parser::Node>_>::end
                             ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
      local_150 = (vector<parser::Node,_std::allocator<parser::Node>_> *)
                  std::back_inserter<std::vector<parser::Node,std::allocator<parser::Node>>>
                            ((vector<parser::Node,_std::allocator<parser::Node>_> *)&start);
      local_158 = (vector<parser::Node,_std::allocator<parser::Node>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<parser::Node*,std::vector<parser::Node,std::allocator<parser::Node>>>,std::back_insert_iterator<std::vector<parser::Node,std::allocator<parser::Node>>>>
                            (local_140,local_148,
                             (back_insert_iterator<std::vector<parser::Node,_std::allocator<parser::Node>_>_>
                              )local_150);
      __gnu_cxx::
      __normal_iterator<parser::Node_const*,std::vector<parser::Node,std::allocator<parser::Node>>>
      ::__normal_iterator<parser::Node*>
                ((__normal_iterator<parser::Node_const*,std::vector<parser::Node,std::allocator<parser::Node>>>
                  *)&local_160,&local_130);
      local_170._M_current =
           (Node *)std::vector<parser::Node,_std::allocator<parser::Node>_>::end
                             ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
      __gnu_cxx::
      __normal_iterator<parser::Node_const*,std::vector<parser::Node,std::allocator<parser::Node>>>
      ::__normal_iterator<parser::Node*>
                ((__normal_iterator<parser::Node_const*,std::vector<parser::Node,std::allocator<parser::Node>>>
                  *)&local_168,&local_170);
      local_178 = (Node *)std::vector<parser::Node,_std::allocator<parser::Node>_>::erase
                                    ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token,
                                     local_160,local_168);
      Production::Production(&local_1f8,actionState.action,(Nodes *)&start);
      Node::Node(&local_1d8,&local_1f8);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::push_back
                ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token,&local_1d8);
      Node::~Node(&local_1d8);
      Production::~Production(&local_1f8);
      local_210._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_38);
      local_208 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator-(&local_210,actionState._8_8_);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_200,
                 &local_208);
      local_220._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_38);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_218,
                 &local_220);
      local_228 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                   ((vector<int,_std::allocator<int>_> *)local_38,local_200,
                                    local_218);
      pvVar2 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_38);
      local_22c = goTo(this,*pvVar2,actionState.action);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_38,&local_22c);
      if ((this->debug & 1U) != 0) {
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                 ::operator*((__normal_iterator<const_lexer::Token_*,_std::vector<lexer::Token,_std::allocator<lexer::Token>_>_>
                              *)&actionState.reduceCount);
        poVar5 = stringifyStep(this,(ostream *)&std::cout,(StateStack *)local_38,(Nodes *)&token,
                               (ActionState *)local_80,pTVar4);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector
                ((vector<parser::Node,_std::allocator<parser::Node>_> *)&start);
    }
    if (local_80._0_4_ == Error) {
      local_252 = 1;
      pPVar6 = (ParserError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"error state",&local_251);
      ParserError::ParserError(pPVar6,&local_250);
      local_252 = 0;
      __cxa_throw(pPVar6,&ParserError::typeinfo,ParserError::~ParserError);
    }
  } while (local_80._0_4_ != Accept);
  sVar7 = std::vector<parser::Node,_std::allocator<parser::Node>_>::size
                    ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
  local_261 = 0;
  if (sVar7 == 1) {
    pvVar8 = std::vector<parser::Node,_std::allocator<parser::Node>_>::back
                       ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
    Node::Node(__return_storage_ptr__,pvVar8);
    std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector
              ((vector<parser::Node,_std::allocator<parser::Node>_> *)&token);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
    return __return_storage_ptr__;
  }
  pPVar6 = (ParserError *)__cxa_allocate_exception(0x10);
  local_261 = 1;
  local_260 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"work done but, stack contains more than one element",&local_289);
  ParserError::ParserError(pPVar6,&local_288);
  local_261 = 0;
  __cxa_throw(pPVar6,&ParserError::typeinfo,ParserError::~ParserError);
}

Assistant:

Node parse(lexer::Tokens const& tokens) {
            StateStack stateStack;
            stateStack.push_back(StartNonTerminal);
            Nodes nodeStack;
            Tokens::const_iterator token = tokens.begin();
            while (true) {
                ActionState actionState = action(stateStack.back(), token->tokenId);
                if (actionState.action == Shift) {
                    nodeStack.push_back(Node(*token));
                    stateStack.push_back(actionState.state);
                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                    ++token;
					if (token == tokens.end()) {
						throw ParserError("error state");
					}
                } else if (actionState.action == Reduce) {
                    Nodes nodes;
                    Nodes::iterator start = nodeStack.end() - actionState.reduceCount;
                    std::copy(start,
                              nodeStack.end(),
                              std::back_inserter(nodes));

                    nodeStack.erase(start, nodeStack.end());
                    nodeStack.push_back(Node(Production(actionState.nonTerminal, nodes)));

                    stateStack.erase(stateStack.end() - actionState.reduceCount, stateStack.end());
                    stateStack.push_back(goTo(stateStack.back(), actionState.nonTerminal));

                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                } else if (actionState.action == Error) {
                    throw ParserError("error state");
                } else if (actionState.action == Accept) {
                    return nodeStack.size() == 1
                           ? nodeStack.back()
                           : throw ParserError("work done but, stack contains more than one element");
                }
            }
        }